

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testScanner(DOMTest *this,XercesDOMParser *parser)

{
  SlicerSource src;
  XMLSize_t slices_1 [2];
  char sampleDoc [185];
  
  memcpy(sampleDoc,
         "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<!-- Document element is document -->\n<document attr=\"value\">\n   <!-- a tag -->\n   <tag>foo</tag>\n\n   <!-- another tag -->\n   <tag/>\n</document>\n"
         ,0xb9);
  SlicerSource::SlicerSource(&src,(XMLByte *)sampleDoc,0xb8,(XMLSize_t *)0x0,0);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource(&src.super_InputSource);
  slices_1[0] = 0x8e;
  slices_1[1] = 1;
  SlicerSource::SlicerSource(&src,(XMLByte *)sampleDoc,0xb8,slices_1,2);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource(&src.super_InputSource);
  slices_1[0] = 0x8e;
  slices_1[1] = 2;
  SlicerSource::SlicerSource(&src,(XMLByte *)sampleDoc,0xb8,slices_1,2);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource(&src.super_InputSource);
  SlicerSource::SlicerSource(&src,(XMLByte *)sampleDoc,0xb8,testScanner::slices,0xb8);
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource(&src.super_InputSource);
  return true;
}

Assistant:

bool DOMTest::testScanner(XercesDOMParser* parser) {
    bool OK = true;

    const char sampleDoc[] =
	    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
	    "<!-- Document element is document -->\n"
	    "<document attr=\"value\">\n"
	    "   <!-- a tag -->\n"
	    "   <tag>foo</tag>\n"
	    "\n"
	    "   <!-- another tag -->\n"
	    "   <tag/>\n"
	    "</document>\n";
    const size_t sampleDocSize = sizeof(sampleDoc) - 1;
    const XMLByte* sampleDocXML = reinterpret_cast<const XMLByte*>(sampleDoc);

    try
	{
		// First, try parsing the document in one hit
		SlicerSource src(sampleDocXML, sampleDocSize);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!' and '--' of a comment
		const XMLSize_t slices[] = { 142, 1 };
		const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!-' and '-' of a comment
		const XMLSize_t slices[] = { 142, 2 };
		const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!-' and '-' of a comment
		static const XMLSize_t slices[] =
        {
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1};
		static const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

    return OK;
}